

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_layout.cc
# Opt level: O0

void __thiscall
Typelib::MemoryLayout::pushMemcpy
          (MemoryLayout *this,size_t size,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *init_data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  runtime_error *this_00;
  value_type_conflict2 local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *init_data_local;
  size_t size_local;
  MemoryLayout *this_local;
  
  local_28 = 0;
  local_20 = init_data;
  init_data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)size;
  size_local = (size_t)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->ops,&local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->ops,(value_type_conflict2 *)&init_data_local);
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(local_20);
  pvVar1 = init_data_local;
  if (bVar2) {
    pushInitSkip(this,(size_t)init_data_local);
  }
  else {
    pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_20);
    if (pvVar1 != pvVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"not enough or too many bytes provided as initialization data");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pushInit(this,local_20);
  }
  return;
}

Assistant:

void MemoryLayout::pushMemcpy(size_t size, vector<uint8_t> const& init_data)
{
    ops.push_back(FLAG_MEMCPY);
    ops.push_back(size);

    if (init_data.empty()) {
        pushInitSkip(size);
    }
    else
    {
        if (size != init_data.size()) {
            throw runtime_error(
                "not enough or too many bytes provided as initialization data"
            );
        }
        pushInit(init_data);
    }
}